

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

int sam_write1(htsFile *fp,bam_hdr_t *h,bam1_t *b)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  
  switch((fp->format).format) {
  case binary_format:
    (fp->format).category = sequence_data;
    (fp->format).format = bam;
  case bam:
    iVar3 = bam_write1((fp->fp).bgzf,b);
    return iVar3;
  case text_format:
    (fp->format).category = sequence_data;
    (fp->format).format = sam;
  case sam:
    iVar3 = sam_format1(h,b,&fp->line);
    if (iVar3 < 0) {
      iVar3 = -1;
    }
    else {
      kputc(10,&fp->line);
      sVar4 = hwrite((fp->fp).hfile,(fp->line).s,(fp->line).l);
      sVar1 = (fp->line).l;
      sVar2 = 0xffffffffffffffff;
      if (sVar4 == sVar1) {
        sVar2 = sVar1;
      }
      iVar3 = (int)sVar2;
    }
    return iVar3;
  default:
    abort();
  case cram:
    iVar3 = cram_put_bam_seq((fp->fp).cram,b);
    return iVar3;
  }
}

Assistant:

int sam_write1(htsFile *fp, const bam_hdr_t *h, const bam1_t *b)
{
    switch (fp->format.format) {
    case binary_format:
        fp->format.category = sequence_data;
        fp->format.format = bam;
        /* fall-through */
    case bam:
        return bam_write1(fp->fp.bgzf, b);

    case cram:
        return cram_put_bam_seq(fp->fp.cram, (bam1_t *)b);

    case text_format:
        fp->format.category = sequence_data;
        fp->format.format = sam;
        /* fall-through */
    case sam:
        if (sam_format1(h, b, &fp->line) < 0) return -1;
        kputc('\n', &fp->line);
        if ( hwrite(fp->fp.hfile, fp->line.s, fp->line.l) != fp->line.l ) return -1;
        return fp->line.l;

    default:
        abort();
    }
}